

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

void ARKodeFree(void **arkode_mem)

{
  ARKodeMem ark_mem;
  ARKodeHAdaptMem __ptr;
  
  ark_mem = (ARKodeMem)*arkode_mem;
  if (ark_mem != (ARKodeMem)0x0) {
    if (ark_mem->step_free != (ARKTimestepFree)0x0) {
      (*ark_mem->step_free)(ark_mem);
    }
    arkFreeVectors(ark_mem);
    __ptr = ark_mem->hadapt_mem;
    if (__ptr != (ARKodeHAdaptMem)0x0) {
      if (__ptr->owncontroller != 0) {
        SUNAdaptController_Destroy(__ptr->hcontroller);
        __ptr = ark_mem->hadapt_mem;
        __ptr->owncontroller = 0;
      }
      free(__ptr);
      ark_mem->hadapt_mem = (ARKodeHAdaptMem)0x0;
    }
    if (ark_mem->interp != (ARKInterp)0x0) {
      arkInterpFree(ark_mem,ark_mem->interp);
      ark_mem->interp = (ARKInterp)0x0;
    }
    if (ark_mem->root_mem != (ARKodeRootMem)0x0) {
      arkRootFree(ark_mem);
      ark_mem->root_mem = (ARKodeRootMem)0x0;
    }
    if (ark_mem->relax_mem != (ARKodeRelaxMem)0x0) {
      arkRelaxDestroy(ark_mem->relax_mem);
      ark_mem->relax_mem = (ARKodeRelaxMem)0x0;
    }
    free(*arkode_mem);
    *arkode_mem = (void *)0x0;
  }
  return;
}

Assistant:

void ARKodeFree(void** arkode_mem)
{
  ARKodeMem ark_mem;

  if (*arkode_mem == NULL) { return; }

  ark_mem = (ARKodeMem)(*arkode_mem);

  /* free the time-stepper module memory (if provided) */
  if (ark_mem->step_free) { ark_mem->step_free(ark_mem); }

  /* free vector storage */
  arkFreeVectors(ark_mem);

  /* free the time step adaptivity module */
  if (ark_mem->hadapt_mem != NULL)
  {
    if (ark_mem->hadapt_mem->owncontroller)
    {
      (void)SUNAdaptController_Destroy(ark_mem->hadapt_mem->hcontroller);
      ark_mem->hadapt_mem->owncontroller = SUNFALSE;
    }
    free(ark_mem->hadapt_mem);
    ark_mem->hadapt_mem = NULL;
  }

  /* free the interpolation module */
  if (ark_mem->interp != NULL)
  {
    arkInterpFree(ark_mem, ark_mem->interp);
    ark_mem->interp = NULL;
  }

  /* free the root-finding module */
  if (ark_mem->root_mem != NULL)
  {
    (void)arkRootFree(ark_mem);
    ark_mem->root_mem = NULL;
  }

  /* free the relaxation module */
  if (ark_mem->relax_mem)
  {
    (void)arkRelaxDestroy(ark_mem->relax_mem);
    ark_mem->relax_mem = NULL;
  }

  free(*arkode_mem);
  *arkode_mem = NULL;
}